

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

iterator __thiscall
QList<QNetworkAccessBackendFactory_*>::begin(QList<QNetworkAccessBackendFactory_*> *this)

{
  QNetworkAccessBackendFactory **n;
  QArrayDataPointer<QNetworkAccessBackendFactory_*> *in_RDI;
  long in_FS_OFFSET;
  iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  detach((QList<QNetworkAccessBackendFactory_*> *)0x192189);
  QArrayDataPointer<QNetworkAccessBackendFactory_*>::operator->(in_RDI);
  n = QArrayDataPointer<QNetworkAccessBackendFactory_*>::begin
                ((QArrayDataPointer<QNetworkAccessBackendFactory_*> *)0x19219a);
  iterator::iterator(&local_10,n);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (iterator)local_10.i;
  }
  __stack_chk_fail();
}

Assistant:

iterator begin() { detach(); return iterator(d->begin()); }